

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynModifyAssignType GetModifyAssignType(LexemeType type)

{
  SynModifyAssignType SVar1;
  
  SVar1 = SYN_MODIFY_ASSIGN_UNKNOWN;
  if (type - lex_addset < 0xb) {
    SVar1 = type - 0x1e;
  }
  return SVar1;
}

Assistant:

SynModifyAssignType GetModifyAssignType(LexemeType type)
{
	switch(type)
	{
	case lex_addset:
		return SYN_MODIFY_ASSIGN_ADD;
	case lex_subset:
		return SYN_MODIFY_ASSIGN_SUB;
	case lex_mulset:
		return SYN_MODIFY_ASSIGN_MUL;
	case lex_divset:
		return SYN_MODIFY_ASSIGN_DIV;
	case lex_powset:
		return SYN_MODIFY_ASSIGN_POW;
	case lex_modset:
		return SYN_MODIFY_ASSIGN_MOD;
	case lex_shlset:
		return SYN_MODIFY_ASSIGN_SHL;
	case lex_shrset:
		return SYN_MODIFY_ASSIGN_SHR;
	case lex_andset:
		return SYN_MODIFY_ASSIGN_BIT_AND;
	case lex_orset:
		return SYN_MODIFY_ASSIGN_BIT_OR;
	case lex_xorset:
		return SYN_MODIFY_ASSIGN_BIT_XOR;
	default:
		break;
	}

	return SYN_MODIFY_ASSIGN_UNKNOWN;
}